

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O3

UChar * icu_63::PatternProps::skipIdentifier(UChar *s,int32_t length)

{
  UBool UVar1;
  int iVar2;
  
  if (0 < length) {
    iVar2 = length + 1;
    do {
      UVar1 = isSyntaxOrWhiteSpace((uint)(ushort)*s);
      if (UVar1 != '\0') {
        return s;
      }
      s = s + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return s;
}

Assistant:

const UChar *
PatternProps::skipIdentifier(const UChar *s, int32_t length) {
    while(length>0 && !isSyntaxOrWhiteSpace(*s)) {
        ++s;
        --length;
    }
    return s;
}